

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O2

void resampler_init(void)

{
  double dVar1;
  long lVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = 0.0;
  for (lVar2 = 0; lVar2 != 0x10004; lVar2 = lVar2 + 4) {
    dVar5 = cos(dVar4 * 0.19634954084936207);
    dVar6 = cos(dVar4 * 0.39269908169872414);
    fVar3 = 0.0;
    if ((ABS(dVar4) < 16.0) && (fVar3 = 1.0, 1e-06 <= ABS(dVar4))) {
      dVar1 = sin(dVar4 * 3.141592653589793);
      fVar3 = (float)(dVar1 / (dVar4 * 3.141592653589793));
    }
    *(float *)((long)sinc_lut + lVar2) = fVar3;
    *(float *)((long)window_lut + lVar2) = (float)(dVar5 * 0.5 + 0.40897 + dVar6 * 0.09103);
    dVar4 = dVar4 + 0.0009765625;
  }
  dVar4 = 0.0;
  for (lVar2 = 0; lVar2 != 0x4000; lVar2 = lVar2 + 0x10) {
    dVar5 = dVar4 * dVar4;
    dVar6 = dVar4 * 0.5;
    *(float *)((long)cubic_lut + lVar2) = (float)((dVar4 - dVar5 * 0.5) * dVar4 - dVar6);
    *(ulong *)((long)cubic_lut + lVar2 + 4) =
         CONCAT44((float)(dVar6 + dVar5 * (2.0 - dVar4 * 1.5)),
                  (float)(dVar5 * (dVar4 * 1.5 + -2.5) + 1.0));
    *(float *)((long)cubic_lut + lVar2 + 0xc) = (float)(dVar6 * dVar4 * dVar4 - dVar6 * dVar4);
    dVar4 = dVar4 + 0.0009765625;
  }
  lVar2 = cpuid_Version_info(1);
  resampler_has_sse = *(uint *)(lVar2 + 8) >> 0x19 & 1;
  return;
}

Assistant:

void resampler_init(void)
{
    unsigned i;
    double dx = (float)(SINC_WIDTH) / SINC_SAMPLES, x = 0.0;
    for (i = 0; i < SINC_SAMPLES + 1; ++i, x += dx)
    {
        double y = x / SINC_WIDTH;
#if 0
        // Blackman
        float window = 0.42659 - 0.49656 * cos(M_PI + M_PI * y) + 0.076849 * cos(2.0 * M_PI * y);
#elif 1
        // Nuttal 3 term
        double window = 0.40897 + 0.5 * cos(M_PI * y) + 0.09103 * cos(2.0 * M_PI * y);
#elif 0
        // C.R.Helmrich's 2 term window
        float window = 0.79445 * cos(0.5 * M_PI * y) + 0.20555 * cos(1.5 * M_PI * y);
#elif 0
        // Lanczos
        float window = sinc(y);
#endif
        sinc_lut[i] = (float)(fabs(x) < SINC_WIDTH ? sinc(x) : 0.0);
        window_lut[i] = (float)window;
    }
    dx = 1.0 / RESAMPLER_RESOLUTION;
    x = 0.0;
    for (i = 0; i < RESAMPLER_RESOLUTION; ++i, x += dx)
    {
        cubic_lut[i*4]   = (float)(-0.5 * x * x * x +       x * x - 0.5 * x);
        cubic_lut[i*4+1] = (float)( 1.5 * x * x * x - 2.5 * x * x           + 1.0);
        cubic_lut[i*4+2] = (float)(-1.5 * x * x * x + 2.0 * x * x + 0.5 * x);
        cubic_lut[i*4+3] = (float)( 0.5 * x * x * x - 0.5 * x * x);
    }
#ifdef RESAMPLER_SSE
    resampler_has_sse = query_cpu_feature_sse();
#endif
}